

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeStrings(WasmBinaryWriter *this)

{
  Module *wasm;
  BufferWithRandomAccess *pBVar1;
  uint uVar2;
  bool bVar3;
  reference __in;
  type *this_00;
  reference __x;
  ulong uVar4;
  size_type sVar5;
  reference __k;
  mapped_type *pmVar6;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar7;
  string_view name;
  string local_468 [32];
  string_view local_448;
  size_t local_438;
  char *pcStack_430;
  undefined1 local_419;
  stringstream local_418 [7];
  bool valid;
  stringstream wtf8;
  ostream local_408 [376];
  string_view *local_290;
  Name *string_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range1_2;
  int32_t local_268;
  undefined4 local_264;
  int32_t start;
  size_type num;
  iterator iStack_250;
  Index i;
  __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> local_248;
  reference local_240;
  Name *string_1;
  iterator __end1_1;
  iterator __begin1_1;
  StringSet *__range1_1;
  vector<wasm::Name,_std::allocator<wasm::Name>_> sorted;
  Name *string;
  iterator __end2;
  iterator __begin2;
  type *__range2;
  type *strings;
  type *func;
  _Self local_1c0;
  iterator __end1;
  iterator __begin1;
  Map *__range1;
  StringSet allStrings;
  key_type local_90;
  mapped_type *local_88;
  mapped_type *globalStrings;
  anon_class_1_0_00000001 local_69;
  Func local_68;
  undefined1 local_48 [8];
  ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  WasmBinaryWriter *this_local;
  
  analysis._48_8_ = this;
  bVar3 = FeatureSet::hasStrings(&this->wasm->features);
  if (!bVar3) {
    __assert_fail("wasm->features.hasStrings()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                  ,0x1ed,"void wasm::WasmBinaryWriter::writeStrings()");
  }
  wasm = this->wasm;
  std::
  function<void(wasm::Function*,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>&)>
  ::function<wasm::WasmBinaryWriter::writeStrings()::__0,void>
            ((function<void(wasm::Function*,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>&)>
              *)&local_68,&local_69);
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)local_48,wasm,&local_68);
  std::
  function<void_(wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_&)>
  ::~function((function<void_(wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_&)>
               *)&local_68);
  local_90 = (key_type)0x0;
  local_88 = std::
             map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
             ::operator[]((map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                           *)&analysis,&local_90);
  writeStrings()::StringWalker::StringWalker(std::unordered_set<wasm::Name,std::hash<wasm::Name>,std
  ::equal_to<wasm::Name>,std::allocator<wasm::Name>_>__(&allStrings._M_h._M_single_bucket,local_88);
  Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_>::walkModuleCode
            ((Walker<StringWalker,_wasm::Visitor<StringWalker,_void>_> *)
             &allStrings._M_h._M_single_bucket,this->wasm);
  writeStrings::StringWalker::~StringWalker((StringWalker *)&allStrings._M_h._M_single_bucket);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&__range1);
  __end1 = std::
           map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
           ::begin((map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                    *)&analysis);
  local_1c0._M_node =
       (_Base_ptr)
       std::
       map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
       ::end((map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
              *)&analysis);
  while( true ) {
    bVar3 = std::operator!=(&__end1,&local_1c0);
    if (!bVar3) break;
    __in = std::
           _Rb_tree_iterator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
           ::operator*(&__end1);
    std::
    get<0ul,wasm::Function*const,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>>
              (__in);
    this_00 = std::
              get<1ul,wasm::Function*const,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>>
                        (__in);
    __end2 = std::
             unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
             ::begin(this_00);
    string = (Name *)std::
                     unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::end(this_00);
    while( true ) {
      bVar3 = std::__detail::operator!=
                        (&__end2.super__Node_iterator_base<wasm::Name,_true>,
                         (_Node_iterator_base<wasm::Name,_true> *)&string);
      if (!bVar3) break;
      __x = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end2);
      pVar7 = std::
              unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
              ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                        *)&__range1,__x);
      sorted.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)pVar7.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
      std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end2);
    }
    std::
    _Rb_tree_iterator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_1);
  __end1_1 = std::
             unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
             ::begin((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                      *)&__range1);
  string_1 = (Name *)std::
                     unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::end((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                            *)&__range1);
  while( true ) {
    bVar3 = std::__detail::operator!=
                      (&__end1_1.super__Node_iterator_base<wasm::Name,_true>,
                       (_Node_iterator_base<wasm::Name,_true> *)&string_1);
    if (!bVar3) break;
    local_240 = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end1_1);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_1,local_240);
    std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end1_1);
  }
  local_248._M_current =
       (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                         ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_1);
  iStack_250 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                         ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_1);
  std::
  sort<__gnu_cxx::__normal_iterator<wasm::Name*,std::vector<wasm::Name,std::allocator<wasm::Name>>>>
            (local_248,
             (__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
             )iStack_250._M_current);
  num._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)num._4_4_;
    sVar5 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                      ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_1);
    uVar2 = num._4_4_;
    if (sVar5 <= uVar4) break;
    __k = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_1,(ulong)num._4_4_
                    );
    pmVar6 = std::
             unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
             ::operator[](&this->stringIndexes,__k);
    *pmVar6 = uVar2;
    num._4_4_ = num._4_4_ + 1;
  }
  _start = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                     ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_1);
  if (_start == 0) {
    local_264 = 1;
  }
  else {
    local_268 = startSection<wasm::BinaryConsts::Section>(this,Strings);
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB
              ((LEB<unsigned_int,_unsigned_char> *)((long)&__range1_2 + 4),0);
    BufferWithRandomAccess::operator<<(pBVar1,__range1_2._4_4_);
    pBVar1 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB((LEB<unsigned_int,_unsigned_char> *)&__range1_2,start);
    BufferWithRandomAccess::operator<<(pBVar1,__range1_2._0_4_);
    __end1_2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                         ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_1);
    string_2 = (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                                 ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_1);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end1_2,
                         (__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                          *)&string_2);
      if (!bVar3) break;
      local_290 = (string_view *)
                  __gnu_cxx::
                  __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                  ::operator*(&__end1_2);
      std::__cxx11::stringstream::stringstream(local_418);
      local_438 = local_290->_M_len;
      pcStack_430 = local_290->_M_str;
      local_419 = String::convertWTF16ToWTF8(local_408,*local_290);
      if (!(bool)local_419) {
        __assert_fail("valid",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                      ,0x228,"void wasm::WasmBinaryWriter::writeStrings()");
      }
      std::__cxx11::stringstream::str();
      name = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_468);
      local_448 = name;
      writeInlineString(this,name);
      std::__cxx11::string::~string(local_468);
      std::__cxx11::stringstream::~stringstream(local_418);
      __gnu_cxx::
      __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
      operator++(&__end1_2);
    }
    finishSection(this,local_268);
    local_264 = 0;
  }
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1_1);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&__range1);
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  ::~ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)local_48);
  return;
}

Assistant:

void WasmBinaryWriter::writeStrings() {
  assert(wasm->features.hasStrings());

  // Scan the entire wasm to find the relevant strings.
  // To find all the string literals we must scan all the code.
  using StringSet = std::unordered_set<Name>;

  struct StringWalker : public PostWalker<StringWalker> {
    StringSet& strings;

    StringWalker(StringSet& strings) : strings(strings) {}

    void visitStringConst(StringConst* curr) { strings.insert(curr->string); }
  };

  ModuleUtils::ParallelFunctionAnalysis<StringSet> analysis(
    *wasm, [&](Function* func, StringSet& strings) {
      if (!func->imported()) {
        StringWalker(strings).walk(func->body);
      }
    });

  // Also walk the global module code (for simplicity, also add it to the
  // function map, using a "function" key of nullptr).
  auto& globalStrings = analysis.map[nullptr];
  StringWalker(globalStrings).walkModuleCode(wasm);

  // Generate the indexes from the combined set of necessary strings,
  // which we sort for determinism.
  StringSet allStrings;
  for (auto& [func, strings] : analysis.map) {
    for (auto& string : strings) {
      allStrings.insert(string);
    }
  }
  std::vector<Name> sorted;
  for (auto& string : allStrings) {
    sorted.push_back(string);
  }
  std::sort(sorted.begin(), sorted.end());
  for (Index i = 0; i < sorted.size(); i++) {
    stringIndexes[sorted[i]] = i;
  }

  auto num = sorted.size();
  if (num == 0) {
    return;
  }

  auto start = startSection(BinaryConsts::Section::Strings);

  // Placeholder for future use in the spec.
  o << U32LEB(0);

  // The number of strings and then their contents.
  o << U32LEB(num);
  for (auto& string : sorted) {
    // Re-encode from WTF-16 to WTF-8.
    std::stringstream wtf8;
    [[maybe_unused]] bool valid = String::convertWTF16ToWTF8(wtf8, string.str);
    assert(valid);
    // TODO: Use wtf8.view() once we have C++20.
    writeInlineString(wtf8.str());
  }

  finishSection(start);
}